

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_d.cpp
# Opt level: O1

void dcopy(int n,double *dx,int incx,double *dy,int incy)

{
  ulong uVar1;
  double *pdVar2;
  uint uVar3;
  double *pdVar4;
  long lVar5;
  ulong uVar6;
  
  if (0 < n) {
    if (incy != 1 || incx != 1) {
      pdVar4 = dx + (incx >> 0x1f & (1 - n) * incx);
      pdVar2 = dy + (incy >> 0x1f & (1 - n) * incy);
      do {
        *pdVar2 = *pdVar4;
        pdVar4 = pdVar4 + incx;
        pdVar2 = pdVar2 + incy;
        n = n + -1;
      } while (n != 0);
      return;
    }
    uVar1 = (ulong)(uint)n;
    uVar3 = (uint)n % 7;
    if (uVar3 != 0) {
      uVar6 = 0;
      do {
        dy[uVar6] = dx[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
    if ((int)uVar3 < n) {
      uVar6 = uVar1 / 7;
      lVar5 = 0;
      do {
        dy[uVar6 * -7 + uVar1 + lVar5] = dx[uVar6 * -7 + uVar1 + lVar5];
        dy[uVar6 * -7 + uVar1 + lVar5 + 1] = dx[uVar6 * -7 + uVar1 + lVar5 + 1];
        dy[uVar6 * -7 + uVar1 + lVar5 + 2] = dx[uVar6 * -7 + uVar1 + lVar5 + 2];
        dy[uVar6 * -7 + uVar1 + lVar5 + 3] = dx[uVar6 * -7 + uVar1 + lVar5 + 3];
        dy[uVar6 * -7 + uVar1 + lVar5 + 4] = dx[uVar6 * -7 + uVar1 + lVar5 + 4];
        dy[uVar6 * -7 + uVar1 + lVar5 + 5] = dx[uVar6 * -7 + uVar1 + lVar5 + 5];
        dy[uVar6 * -7 + uVar1 + lVar5 + 6] = dx[uVar6 * -7 + uVar1 + lVar5 + 6];
        lVar5 = lVar5 + 7;
      } while ((int)uVar6 * -7 + n + (int)lVar5 < n);
    }
  }
  return;
}

Assistant:

void dcopy ( int n, double dx[], int incx, double dy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    DCOPY copies a vector X to a vector Y.
//
//  Discussion:
//
//    The routine uses unrolled loops for increments equal to one.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 May 2005
//
//  Author:
//
//    Original FORTRAN77 version by Charles Lawson, Richard Hanson, 
//    David Kincaid, Fred Krogh.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of elements in DX and DY.
//
//    Input, double DX[*], the first vector.
//
//    Input, int INCX, the increment between successive entries of DX.
//
//    Output, double DY[*], the second vector.
//
//    Input, int INCY, the increment between successive entries of DY.
//
{
  int i;
  int ix;
  int iy;
  int m;

  if ( n <= 0 )
  {
    return;
  }

  if ( incx == 1 && incy == 1 )
  {
    m = n % 7;

    if ( m != 0 )
    {
      for ( i = 0; i < m; i++ )
      {
        dy[i] = dx[i];
      }
    }

    for ( i = m; i < n; i = i + 7 )
    {
      dy[i] = dx[i];
      dy[i + 1] = dx[i + 1];
      dy[i + 2] = dx[i + 2];
      dy[i + 3] = dx[i + 3];
      dy[i + 4] = dx[i + 4];
      dy[i + 5] = dx[i + 5];
      dy[i + 6] = dx[i + 6];
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      dy[iy] = dx[ix];
      ix = ix + incx;
      iy = iy + incy;
    }

  }

  return;
}